

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

void ncnn::binary_op_broadcast<ncnn::binary_op_sub>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  long lVar19;
  long lVar20;
  float *pfVar21;
  ulong uVar22;
  void *pvVar23;
  long lVar24;
  long lVar25;
  float *pfVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  void *pvVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong local_98;
  
  iVar1 = c->dims;
  uVar2 = c->w;
  uVar3 = c->h;
  iVar4 = c->d;
  uVar5 = c->c;
  if (iVar1 == 2) {
    if ((int)uVar3 < 1) {
      return;
    }
    pvVar11 = a->data;
    iVar6 = a->w;
    pvVar14 = b->data;
    iVar7 = b->w;
    pvVar23 = c->data;
    sVar12 = c->elemsize;
    sVar13 = a->elemsize;
    uVar28 = (ulong)(a->h + -1);
    sVar15 = b->elemsize;
    uVar30 = (ulong)(b->h + -1);
    uVar37 = 0;
    do {
      uVar22 = uVar28;
      if ((long)uVar37 < (long)uVar28) {
        uVar22 = uVar37;
      }
      uVar35 = uVar30;
      if ((long)uVar37 < (long)uVar30) {
        uVar35 = uVar37;
      }
      if (0 < (int)uVar2) {
        pfVar21 = (float *)(uVar22 * (long)iVar6 * sVar13 + (long)pvVar11);
        pfVar26 = (float *)(uVar35 * (long)iVar7 * sVar15 + (long)pvVar14);
        uVar22 = 0;
        do {
          *(float *)((long)pvVar23 + uVar22 * 4) = *pfVar21 - *pfVar26;
          uVar22 = uVar22 + 1;
          pfVar21 = pfVar21 + (1 < (long)iVar6);
          pfVar26 = pfVar26 + (1 < (long)iVar7);
        } while (uVar2 != uVar22);
      }
      uVar37 = uVar37 + 1;
      pvVar23 = (void *)((long)pvVar23 + sVar12 * (long)(int)uVar2);
    } while (uVar37 != uVar3);
  }
  else if (iVar1 == 1) {
    if ((int)uVar2 < 1) {
      return;
    }
    pvVar11 = c->data;
    iVar6 = b->w;
    iVar7 = a->w;
    pfVar21 = (float *)b->data;
    pfVar26 = (float *)a->data;
    uVar30 = 0;
    do {
      *(float *)((long)pvVar11 + uVar30 * 4) = *pfVar26 - *pfVar21;
      uVar30 = uVar30 + 1;
      pfVar26 = pfVar26 + (1 < iVar7);
      pfVar21 = pfVar21 + (1 < iVar6);
    } while (uVar2 != uVar30);
  }
  if (0 < (int)uVar5 && iVar1 - 3U < 2) {
    pvVar11 = c->data;
    sVar12 = c->cstep;
    sVar13 = c->elemsize;
    iVar1 = a->w;
    iVar6 = b->w;
    local_98 = 0;
    do {
      if (0 < iVar4) {
        pvVar34 = (void *)(sVar12 * sVar13 * local_98 + (long)pvVar11);
        iVar7 = a->w;
        iVar8 = a->h;
        pvVar14 = a->data;
        sVar15 = a->elemsize;
        iVar9 = b->w;
        iVar10 = b->h;
        pvVar23 = b->data;
        sVar16 = b->elemsize;
        uVar30 = (ulong)(b->c + -1);
        if ((long)local_98 < (long)uVar30) {
          uVar30 = local_98;
        }
        sVar17 = b->cstep;
        lVar31 = (long)(b->d + -1);
        uVar37 = (ulong)(a->c + -1);
        if ((long)local_98 < (long)uVar37) {
          uVar37 = local_98;
        }
        sVar18 = a->cstep;
        lVar24 = (long)(iVar10 + -1);
        lVar19 = (long)(a->d + -1);
        lVar27 = (long)(iVar8 + -1);
        lVar29 = 0;
        do {
          lVar36 = lVar31;
          if (lVar29 < lVar31) {
            lVar36 = lVar29;
          }
          lVar32 = lVar19;
          if (lVar29 < lVar19) {
            lVar32 = lVar29;
          }
          if (0 < (int)uVar3) {
            lVar33 = 0;
            do {
              lVar25 = lVar24;
              if (lVar33 < lVar24) {
                lVar25 = lVar33;
              }
              lVar20 = lVar27;
              if (lVar33 < lVar27) {
                lVar20 = lVar33;
              }
              if (0 < (int)uVar2) {
                pfVar26 = (float *)(((lVar25 + lVar36 * iVar10) * (long)iVar9 + uVar30 * sVar17) *
                                    sVar16 + (long)pvVar23);
                pfVar21 = (float *)(((lVar20 + lVar32 * iVar8) * (long)iVar7 + uVar37 * sVar18) *
                                    sVar15 + (long)pvVar14);
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar34 + uVar28 * 4) = *pfVar21 - *pfVar26;
                  uVar28 = uVar28 + 1;
                  pfVar26 = pfVar26 + (1 < iVar6);
                  pfVar21 = pfVar21 + (1 < iVar1);
                } while (uVar2 != uVar28);
              }
              pvVar34 = (void *)((long)pvVar34 + (long)(int)uVar2 * 4);
              lVar33 = lVar33 + 1;
            } while ((uint)lVar33 != uVar3);
          }
          lVar29 = lVar29 + 1;
        } while ((int)lVar29 != iVar4);
      }
      local_98 = local_98 + 1;
    } while (local_98 != uVar5);
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    // general broadcast
    const Op op;

    const int dims = c.dims;
    const int w = c.w;
    const int h = c.h;
    const int d = c.d;
    const int channels = c.c;

    if (dims == 1)
    {
        const float* ptr = a;
        const float* ptr1 = b;
        float* outptr = c;

        const int ainc = a.w > 1 ? 1 : 0;
        const int binc = b.w > 1 ? 1 : 0;

        for (int x = 0; x < w; x++)
        {
            outptr[x] = op(*ptr, *ptr1);
            ptr += ainc;
            ptr1 += binc;
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(std::min(y, a.h - 1));
            const float* ptr1 = b.row(std::min(y, b.h - 1));
            float* outptr = c.row(y);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(*ptr, *ptr1);
                ptr += ainc;
                ptr1 += binc;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = c.channel(q);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int z = 0; z < d; z++)
            {
                for (int y = 0; y < h; y++)
                {
                    const float* ptr = a.channel(std::min(q, a.c - 1)).depth(std::min(z, a.d - 1)).row(std::min(y, a.h - 1));
                    const float* ptr1 = b.channel(std::min(q, b.c - 1)).depth(std::min(z, b.d - 1)).row(std::min(y, b.h - 1));

                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(*ptr, *ptr1);
                        ptr += ainc;
                        ptr1 += binc;
                    }

                    outptr += w;
                }
            }
        }
    }
}